

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

int recff_bit64_nary(jit_State *J,RecordFFData *rd)

{
  uint32_t uVar1;
  CTState *cts_00;
  CTypeID CVar2;
  TRef TVar3;
  CType *d;
  TRef local_88;
  TRef tr2;
  TRef tr;
  uint32_t ot;
  CType *ct;
  uint local_70;
  CTypeID aid;
  MSize i;
  CTypeID id;
  CTState *cts;
  RecordFFData *rd_local;
  jit_State *J_local;
  
  cts_00 = (CTState *)J[-1].penalty[0x3b].pc.ptr64;
  aid = 0;
  for (local_70 = 0; J->base[local_70] != 0; local_70 = local_70 + 1) {
    CVar2 = crec_bit64_type(cts_00,rd->argv + local_70);
    if (aid < CVar2) {
      aid = CVar2;
    }
  }
  if (aid == 0) {
    J_local._4_4_ = 0;
  }
  else {
    d = cts_00->tab + aid;
    uVar1 = rd->data;
    local_88 = crec_ct_tv(J,d,0,*J->base,rd->argv);
    for (local_70 = 1; J->base[local_70] != 0; local_70 = local_70 + 1) {
      TVar3 = crec_ct_tv(J,d,0,J->base[local_70],rd->argv + local_70);
      (J->fold).ins.field_0.ot = (ushort)(uVar1 << 8) | (short)aid + 10U;
      (J->fold).ins.field_0.op1 = (IRRef1)local_88;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
      local_88 = lj_opt_fold(J);
    }
    TVar3 = lj_ir_kint(J,aid);
    (J->fold).ins.field_0.ot = 0x548a;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
    (J->fold).ins.field_0.op2 = (IRRef1)local_88;
    TVar3 = lj_opt_fold(J);
    *J->base = TVar3;
    J_local._4_4_ = 1;
  }
  return J_local._4_4_;
}

Assistant:

int LJ_FASTCALL recff_bit64_nary(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  CTypeID id = 0;
  MSize i;
  for (i = 0; J->base[i] != 0; i++) {
    CTypeID aid = crec_bit64_type(cts, &rd->argv[i]);
    if (id < aid) id = aid;  /* Determine highest type rank of all arguments. */
  }
  if (id) {
    CType *ct = ctype_get(cts, id);
    uint32_t ot = IRT(rd->data, id-CTID_INT64+IRT_I64);
    TRef tr = crec_ct_tv(J, ct, 0, J->base[0], &rd->argv[0]);
    for (i = 1; J->base[i] != 0; i++) {
      TRef tr2 = crec_ct_tv(J, ct, 0, J->base[i], &rd->argv[i]);
      tr = emitir(ot, tr, tr2);
    }
    J->base[0] = emitir(IRTG(IR_CNEWI, IRT_CDATA), lj_ir_kint(J, id), tr);
    return 1;
  }
  return 0;
}